

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O3

char * icetGetStrategyName(void)

{
  char *pcVar1;
  IceTEnum strategy;
  IceTEnum local_c;
  
  icetGetEnumv(0x24,&local_c);
  if (local_c == 0xffffffff) {
    icetRaiseDiagnostic("No strategy set. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x36);
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = icetStrategyNameFromEnum(local_c);
  }
  return pcVar1;
}

Assistant:

const char *icetGetStrategyName(void)
{
    IceTEnum strategy;

    icetGetEnumv(ICET_STRATEGY, &strategy);
    if (strategy != ICET_STRATEGY_UNDEFINED) {
        return icetStrategyNameFromEnum(strategy);
    } else {
        icetRaiseError("No strategy set. Use icetStrategy to set the strategy.",
                       ICET_INVALID_ENUM);
        return NULL;
    }
}